

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> * __thiscall
fasttext::Meter::precisionRecallCurve
          (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  pointer ppVar1;
  double dVar2;
  uint64_t uVar3;
  bool bVar4;
  const_iterator cVar5;
  undefined8 uVar6;
  difference_type __d;
  ulong uVar7;
  pointer ppVar8;
  ulong uVar9;
  pointer ppVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  double recall;
  double precision;
  double local_80;
  double local_78;
  int32_t local_6c;
  pair<double,_double> local_68;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_50;
  uint64_t local_38;
  
  auVar11 = in_ZMM1._0_16_;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c = labelId;
  getPositiveCounts(&local_50,this,labelId);
  if (local_50.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_50.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (labelId != -1) {
      cVar5 = std::
              _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->labelMetrics_)._M_h,&local_6c);
      if (cVar5.super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>.
          _M_cur == (__node_type *)0x0) {
        uVar6 = std::__throw_out_of_range("_Map_base::at");
        if (local_50.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_50.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (ppVar1 != (pointer)0x0) {
          operator_delete(ppVar1,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppVar1);
        }
        _Unwind_Resume(uVar6);
      }
      this = (Meter *)((long)cVar5.
                             super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
                             ._M_cur + 0x10);
    }
    local_38 = (this->metrics_).gold;
    uVar9 = (long)local_50.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_50.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    ppVar10 = local_50.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (long)uVar9) {
      auVar11 = vcvtusi2sd_avx512f(auVar11,local_38);
      local_78 = auVar11._0_8_;
      do {
        uVar7 = uVar9 >> 1;
        local_68 = (pair<double,_double>)vcvtuqq2pd_avx512vl((undefined1  [16])ppVar10[uVar7]);
        local_80 = local_78;
        bVar4 = utils::compareFirstLess(&local_68,&local_80);
        uVar9 = uVar9 + ~uVar7;
        ppVar8 = ppVar10 + uVar7 + 1;
        if (!bVar4) {
          uVar9 = uVar7;
          ppVar8 = ppVar10;
        }
        ppVar10 = ppVar8;
      } while (0 < (long)uVar9);
    }
    uVar3 = local_38;
    if (local_50.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        ppVar10 + (ppVar10 !=
                  local_50.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
      auVar11 = vcvtusi2sd_avx512f(in_XMM2,local_38);
      local_78 = auVar11._0_8_;
      ppVar8 = local_50.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        dVar2 = local_68.second;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_68.second;
        local_68 = (pair<double,_double>)(auVar11 << 0x40);
        auVar11 = vcvtuqq2pd_avx512vl((undefined1  [16])*ppVar8);
        dVar12 = auVar11._0_8_;
        dVar13 = dVar12 + auVar11._8_8_;
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          local_68.first = dVar12 / dVar13;
          local_68 = (pair<double,_double>)CONCAT88(dVar2,local_68.first);
        }
        local_80 = (double)((ulong)(uVar3 == 0) * 0x7ff8000000000000 +
                           (ulong)(uVar3 != 0) * (long)(dVar12 / local_78));
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<double&,double&>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   __return_storage_ptr__,&local_68.first,&local_80);
        ppVar8 = ppVar8 + 1;
      } while (ppVar8 != ppVar10 + (ppVar10 !=
                                   local_50.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish));
    }
    local_68.first = 1.0;
    local_80 = 0.0;
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<double,double>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               __return_storage_ptr__,&local_68.first,&local_80);
  }
  if (local_50.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<double, double>> Meter::precisionRecallCurve(
    int32_t labelId) const {
  std::vector<std::pair<double, double>> precisionRecallCurve;
  const auto& positiveCounts = getPositiveCounts(labelId);
  if (positiveCounts.empty()) {
    return precisionRecallCurve;
  }

  uint64_t golds =
      (labelId == kAllLabels) ? metrics_.gold : labelMetrics_.at(labelId).gold;

  auto fullRecall = std::lower_bound(
      positiveCounts.begin(),
      positiveCounts.end(),
      golds,
      utils::compareFirstLess);

  if (fullRecall != positiveCounts.end()) {
    fullRecall = std::next(fullRecall);
  }

  for (auto it = positiveCounts.begin(); it != fullRecall; it++) {
    double precision = 0.0;
    double truePositives = it->first;
    double falsePositives = it->second;
    if (truePositives + falsePositives != 0.0) {
      precision = truePositives / (truePositives + falsePositives);
    }
    double recall = golds != 0 ? (truePositives / double(golds))
                               : std::numeric_limits<double>::quiet_NaN();
    precisionRecallCurve.emplace_back(precision, recall);
  }
  precisionRecallCurve.emplace_back(1.0, 0.0);

  return precisionRecallCurve;
}